

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

void cereal::
     load<cereal::BinaryInputArchive,eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>
               (BinaryInputArchive *ar,
               variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
               *variant)

{
  type args;
  Exception *this;
  int local_1c;
  variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
  *pvStack_18;
  int32_t index;
  variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
  *variant_local;
  BinaryInputArchive *ar_local;
  
  pvStack_18 = variant;
  variant_local =
       (variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
        *)ar;
  args = make_nvp<cereal::BinaryInputArchive,int&>("index",&local_1c);
  InputArchive<cereal::BinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::BinaryInputArchive,1u> *)ar,args);
  if (1 < local_1c) {
    this = (Exception *)__cxa_allocate_exception(0x10);
    Exception::Exception(this,"Invalid \'index\' selector when deserializing std::variant");
    __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
  }
  std::enable_if<(0)<(std::variant_size_v<std::variant<eos::morphablemodel::PcaModel,std::vector<eos
  ::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>),void>::
  type_cereal::variant_detail::load_variant<0,std::variant<eos::morphablemodel::PcaModel,std::
  vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>,cereal::
  BinaryInputArchive>((BinaryInputArchive *)variant_local,local_1c,pvStack_18);
  return;
}

Assistant:

inline
  void CEREAL_LOAD_FUNCTION_NAME( Archive & ar, std::variant<VariantTypes...> & variant )
  {
    using variant_t = typename std::variant<VariantTypes...>;

    std::int32_t index;
    ar( CEREAL_NVP_("index", index) );
    if(index >= static_cast<std::int32_t>(std::variant_size_v<variant_t>))
      throw Exception("Invalid 'index' selector when deserializing std::variant");

    variant_detail::load_variant<0>(ar, index, variant);
  }